

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  double weight;
  int v;
  int l;
  int w;
  double *transMatrix;
  undefined4 local_cc;
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double p03;
  double p02;
  double p01;
  double p00;
  double p13;
  double p12;
  double p11;
  double p10;
  int k;
  double m133;
  double m132;
  
  lVar26 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_ECX * 8);
  p13._4_4_ = 0;
  for (p13._0_4_ = 0; p13._0_4_ < *(int *)(in_RDI + 0x34); p13._0_4_ = p13._0_4_ + 1) {
    p00._4_4_ = p13._0_4_ * *(int *)(in_RDI + 0x18) * 4;
    uVar1 = *(ulong *)((long)m130 + (long)p13._0_4_ * 8);
    uVar2 = *(ulong *)(lVar26 + (long)p13._4_4_ * 8);
    dVar3 = *(double *)(lVar26 + (long)(p13._4_4_ + 1) * 8);
    uVar4 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 2) * 8);
    uVar5 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 3) * 8);
    uVar6 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 5) * 8);
    dVar7 = *(double *)(lVar26 + (long)(p13._4_4_ + 6) * 8);
    uVar8 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 7) * 8);
    uVar9 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 8) * 8);
    uVar10 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 10) * 8);
    dVar11 = *(double *)(lVar26 + (long)(p13._4_4_ + 0xb) * 8);
    uVar12 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 0xc) * 8);
    uVar13 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 0xd) * 8);
    uVar14 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 0xf) * 8);
    dVar15 = *(double *)(lVar26 + (long)(p13._4_4_ + 0x10) * 8);
    uVar16 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 0x11) * 8);
    uVar17 = *(ulong *)(lVar26 + (long)(p13._4_4_ + 0x12) * 8);
    for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x14); local_cc = local_cc + 1) {
      uVar18 = *(ulong *)(in_RSI + (long)p00._4_4_ * 8);
      dVar19 = *(double *)(in_RSI + (long)(p00._4_4_ + 1) * 8);
      uVar20 = *(ulong *)(in_RSI + (long)(p00._4_4_ + 2) * 8);
      uVar21 = *(ulong *)(in_RSI + (long)(p00._4_4_ + 3) * 8);
      uVar22 = *(ulong *)(in_RDX + (long)p00._4_4_ * 8);
      dVar23 = *(double *)(in_RDX + (long)(p00._4_4_ + 1) * 8);
      uVar24 = *(ulong *)(in_RDX + (long)(p00._4_4_ + 2) * 8);
      uVar25 = *(ulong *)(in_RDX + (long)(p00._4_4_ + 3) * 8);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar2;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar18;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar3 * dVar19;
      auVar27 = vfmadd213sd_fma(auVar47,auVar27,auVar59);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar4;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar20;
      auVar27 = vfmadd213sd_fma(auVar60,auVar28,auVar27);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar5;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar21;
      auVar27 = vfmadd213sd_fma(auVar29,auVar48,auVar27);
      auVar43._0_8_ = auVar27._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar6;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar18;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar7 * dVar19;
      auVar27 = vfmadd213sd_fma(auVar49,auVar30,auVar61);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar8;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar20;
      auVar27 = vfmadd213sd_fma(auVar62,auVar31,auVar27);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar9;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar21;
      auVar27 = vfmadd213sd_fma(auVar32,auVar50,auVar27);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar10;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar18;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar11 * dVar19;
      auVar28 = vfmadd213sd_fma(auVar51,auVar33,auVar63);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar12;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar20;
      auVar28 = vfmadd213sd_fma(auVar64,auVar34,auVar28);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar13;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar21;
      auVar28 = vfmadd213sd_fma(auVar35,auVar52,auVar28);
      auVar44._0_8_ = auVar28._0_8_;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar14;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar18;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = dVar15 * dVar19;
      auVar28 = vfmadd213sd_fma(auVar53,auVar36,auVar65);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar16;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar20;
      auVar28 = vfmadd213sd_fma(auVar66,auVar37,auVar28);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar17;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar21;
      auVar28 = vfmadd213sd_fma(auVar38,auVar54,auVar28);
      auVar45._0_8_ = auVar28._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar18;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar22;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar19 * dVar23;
      auVar28 = vfmadd213sd_fma(auVar55,auVar39,auVar67);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar20;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar24;
      auVar28 = vfmadd213sd_fma(auVar68,auVar40,auVar28);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar21;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar25;
      auVar28 = vfmadd213sd_fma(auVar56,auVar41,auVar28);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar1;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf8) + (long)local_cc * 8);
      auVar28 = vfmadd213sd_fma(auVar42,auVar28,auVar69);
      *(long *)(*(long *)(in_RDI + 0xf8) + (long)local_cc * 8) = auVar28._0_8_;
      auVar43._8_8_ = 0;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar22;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = auVar27._0_8_ * dVar23;
      auVar27 = vfmadd213sd_fma(auVar57,auVar43,auVar70);
      auVar44._8_8_ = 0;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar24;
      auVar27 = vfmadd213sd_fma(auVar71,auVar44,auVar27);
      auVar45._8_8_ = 0;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar25;
      auVar27 = vfmadd213sd_fma(auVar58,auVar45,auVar27);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar1;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x100) + (long)local_cc * 8);
      auVar27 = vfmadd213sd_fma(auVar46,auVar27,auVar72);
      *(long *)(*(long *)(in_RDI + 0x100) + (long)local_cc * 8) = auVar27._0_8_;
      p00._4_4_ = p00._4_4_ + 4;
    }
    p13._4_4_ = p13._4_4_ + 0x14;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                             const REALTYPE *preOrderPartial,
                                                                             const int firstDerivativeIndex,
                                                                             const int secondDerivativeIndex,
                                                                             const double *categoryRates,
                                                                             const REALTYPE *categoryWeights,
                                                                             const int scalingFactorsIndex,
                                                                             double *outDerivatives,
                                                                             double *outSumDerivatives,
                                                                             double *outSumSquaredDerivatives) {

    const REALTYPE* transMatrix = gTransitionMatrices[firstDerivativeIndex];

    int w = 0;
    for(int l = 0; l < kCategoryCount; l++) {

        int v = l*kPaddedPatternCount*4;

        const REALTYPE weight = categoryWeights[l];

        PREFETCH_MATRIX(1,transMatrix,w); // TODO Use _TRANSPOSE and then reverse integration below

        for(int k = 0; k < kPatternCount; k++) {

            PREFETCH_PARTIALS(1, postOrderPartial,v);
            PREFETCH_PARTIALS(0, preOrderPartial, v);


            DO_INTEGRATION(1);

//            grandNumeratorDerivTmp[k] += (sum10 * prePartials[v] + sum11 * prePartials[v + 1]
//                    + sum12 * prePartials[v + 2] + sum13 * prePartials[v + 3]) * weight;
//            grandDenominatorDerivTmp[k] += (postPartials[v] * prePartials[v] + postPartials[v + 1] * prePartials[v + 1]
//                    + postPartials[v + 2] * prePartials[v + 2] + postPartials[v + 3] * prePartials[v + 3]) * weight;

            grandDenominatorDerivTmp[k] += (p10 * p00 + p11 * p01 + p12 * p02 + p13 * p03) * weight;
            grandNumeratorDerivTmp[k] += (sum10 * p00 + sum11 * p01 + sum12 * p02 + sum13 * p03) * weight;

            v += 4;
        }
        w += OFFSET*4;
    }
}